

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZSS.cpp
# Opt level: O3

void DatUnpacker::LZSS::decompress(uchar *input,uint inputSize,uchar *output,uint outputSize)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ushort uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  uchar dictionary [4096];
  byte local_1038 [4104];
  
  if (inputSize != 0) {
    pbVar2 = input + inputSize;
    pbVar9 = output + outputSize;
    do {
      uVar10 = (long)(short)((ushort)*input << 8) | (ulong)input[1];
      if ((short)uVar10 == 0) {
        return;
      }
      pbVar12 = input + 2;
      if ((short)((ushort)*input << 8) < 0) {
        if (output < pbVar9) {
          do {
            bVar5 = *pbVar12;
            pbVar12 = pbVar12 + 1;
            *output = bVar5;
            output = output + 1;
            if (input + (2 - uVar10) <= pbVar12) break;
          } while (output < pbVar9);
        }
      }
      else {
        memset(local_1038,0x20,0x1000);
        pbVar3 = input + uVar10 + 2;
        uVar4 = 0xfee;
        do {
          pbVar11 = pbVar12 + 1;
          if (pbVar11 < pbVar3) {
            bVar5 = *pbVar12;
            iVar6 = 0;
            do {
              pbVar12 = pbVar11 + 1;
              bVar1 = *pbVar11;
              if ((bVar5 & 1) == 0) {
                uVar8 = (uint)bVar1 | (*pbVar12 & 0xf0) << 4;
                iVar7 = (*pbVar12 & 0xf) + 3;
                do {
                  bVar1 = local_1038[uVar8 & 0xffff];
                  *output = bVar1;
                  output = output + 1;
                  local_1038[uVar4] = bVar1;
                  uVar8 = uVar8 + 1;
                  uVar4 = uVar4 + 1;
                  if (0xfff < uVar4) {
                    uVar4 = 0;
                  }
                  if (0xfff < (uVar8 & 0xffff)) {
                    uVar8 = 0;
                  }
                  iVar7 = iVar7 + -1;
                } while (iVar7 != 0);
                pbVar12 = pbVar11 + 2;
              }
              else {
                *output = bVar1;
                output = output + 1;
                local_1038[uVar4] = bVar1;
                uVar4 = uVar4 + 1;
                if (0xfff < uVar4) {
                  uVar4 = 0;
                }
              }
              iVar6 = iVar6 + 1;
              pbVar11 = pbVar12;
            } while ((iVar6 != 8) && (bVar5 = bVar5 >> 1, pbVar12 < pbVar3));
          }
          pbVar12 = pbVar11;
        } while (pbVar12 < pbVar3);
      }
      input = pbVar12;
    } while (input < pbVar2);
  }
  return;
}

Assistant:

void  LZSS::decompress(unsigned char* input, unsigned int inputSize, unsigned char* output, unsigned int outputSize)
    {
        const unsigned short D = 4096;
        unsigned short DO, DI = 0;
        short N;
        unsigned char dictionary[D];
        unsigned char F = 0;
        unsigned char L = 0;
        unsigned char* inputEnd = input + inputSize;
        unsigned char* outputEnd = output + outputSize;

        while (input < inputEnd)
        {

            N = *(input++) << 8;
            N |= *(input++);
            if (N == 0) return;

            if (N < 0)
            {
                unsigned char* end = input - N;
                while (input < end && output < outputEnd)
                {
                    unsigned char byte = *(input++);
                    *(output++) = byte;
                }
            }
            else
            {
                DO = D-18;
                memset(dictionary, ' ', D);
                unsigned char* end = input + N;
                while (input < end)
                {
                    F = *(input++);
                    for (unsigned int i = 0; i != 8 && input < end; ++i)
                    {
                        if ((F & 1) != 0)
                        {
                            unsigned char byte = *(input++);
                            *(output++) = byte;
                            dictionary[DO] = byte;
                            DO++;
                            if (DO >= D) DO = 0;
                        }
                        else
                        {
                            DI = *(input++);
                            L = *(input++);
                            DI = DI | ((0xF0 & L) << 4);
                            L &= 0x0F;

                            for (int j = 0; j < L+3; j++)
                            {
                                unsigned char byte = dictionary[DI];
                                *(output++) = byte;
                                dictionary[DO] = byte;
                                DI++;
                                DO++;
                                if (DO >= D) DO = 0;
                                if (DI >= D) DI = 0;
                            }
                        }
                        F >>= 1;
                    }
                }
            }
        }
    }